

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.h
# Opt level: O2

string * __thiscall
units::
repr<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,units *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *begin,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *end)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
  if (begin->_M_current != pbVar1) {
    std::__cxx11::string::string((string *)&local_70,(string *)pbVar1);
    repr(&local_50,&local_70);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    pbVar1 = pbVar1 + 1;
  }
  for (; pbVar1 != begin->_M_current; pbVar1 = pbVar1 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_90,(string *)pbVar1);
    repr(&local_50,&local_90);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string repr(const T& begin, const T& end) {
    std::string result;
    result += "[";

    // loop to repr the content
    T it = begin;
    if(begin != end) {
        result += repr(*begin);
        it ++;
    }
    for(; it != end; ++it) {
        result += ", ";
        result += repr(*it);
    }

    result += "]";
    return result;
}